

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogComboBox::showPopup(QFileDialogComboBox *this)

{
  QFileSystemModel *pQVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  QAbstractItemModel *pQVar8;
  QAbstractItemModel *pQVar9;
  long *plVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  QUrl *pQVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QUrl url;
  QUrl path;
  QUrl local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QArrayDataPointer<QUrl> local_b8;
  QArrayData *local_98;
  char16_t *pcStack_90;
  long *local_88;
  QArrayDataPointer<QUrl> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = QComboBox::model(&this->super_QComboBox);
  local_58._forAlignment = -NAN;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  iVar5 = (**(code **)(*(long *)pQVar8 + 0x78))(pQVar8);
  if (1 < iVar5) {
    QComboBox::showPopup(&this->super_QComboBox);
  }
  local_58._16_8_ = (long *)0x0;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = (char16_t *)0x0;
  QUrlModel::setUrls(this->urlModel,(QList<QUrl> *)&local_58);
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QUrl *)0x0;
  local_78.size = 0;
  local_88 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_90 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->d_ptr->model;
  if (pQVar1 == (QFileSystemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = L"/";
    local_58._16_8_ = (long *)0x1;
  }
  else {
    QFileSystemModel::rootPath();
  }
  QFileSystemModel::index((QString *)&local_98,(int)pQVar1);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  if (((-1 < (int)local_98) && (-1 < (long)local_98)) && (local_88 != (long *)0x0)) {
    do {
      local_d0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      if (local_88 == (long *)0x0) {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (char16_t *)0x0;
        local_58._16_8_ = (long *)0x0;
        local_40 = 2;
      }
      else {
        (**(code **)(*local_88 + 0x90))(&local_58,local_88,&local_98,0x101);
      }
      ::QVariant::toString();
      QUrl::fromLocalFile((QString *)&local_d0);
      if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d)->super_QArrayData,2,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      cVar4 = QUrl::isValid();
      if (cVar4 != '\0') {
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
                  ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,&local_d0);
        QList<QUrl>::end((QList<QUrl> *)&local_78);
      }
      if (local_88 == (long *)0x0) {
        local_58._forAlignment = -NAN;
        local_58._8_8_ = (char16_t *)0x0;
        local_58._16_8_ = (long *)0x0;
      }
      else {
        (**(code **)(*local_88 + 0x68))(&local_58,local_88,&local_98);
      }
      local_88 = (long *)local_58._16_8_;
      local_98 = (QArrayData *)local_58.shared;
      pcStack_90 = (char16_t *)local_58._8_8_;
      QUrl::~QUrl(&local_d0);
    } while (((-1 < (int)local_98) && (-1 < (long)local_98)) && (local_88 != (long *)0x0));
  }
  QVar16.m_data = (storage_type *)0x5;
  QVar16.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar16);
  local_b8.d = (Data *)local_58.shared;
  local_b8.ptr = (QUrl *)local_58._8_8_;
  local_b8.size = local_58._16_8_;
  QUrl::QUrl((QUrl *)&local_58.shared,(QString *)&local_b8,TolerantMode);
  QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
            ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,(QUrl *)&local_58.shared);
  QList<QUrl>::end((QList<QUrl> *)&local_78);
  QUrl::~QUrl((QUrl *)&local_58.shared);
  if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d)->super_QArrayData,2,0x10);
    }
  }
  QUrlModel::addUrls(this->urlModel,(QList<QUrl> *)&local_78,0,true);
  pQVar8 = QComboBox::model(&this->super_QComboBox);
  pQVar9 = QComboBox::model(&this->super_QComboBox);
  local_b8.d = (Data *)0xffffffffffffffff;
  local_b8.ptr = (QUrl *)0x0;
  local_b8.size = 0;
  iVar5 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9,&local_b8);
  local_d0.d = (QUrlPrivate *)0xffffffffffffffff;
  local_c8 = 0;
  uStack_c0 = 0;
  (**(code **)(*(long *)pQVar8 + 0x60))(&local_58,pQVar8,iVar5 + -1,0);
  local_88 = (long *)local_58._16_8_;
  local_98 = (QArrayData *)local_58.shared;
  pcStack_90 = (char16_t *)local_58._8_8_;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QUrl *)0x0;
  local_b8.size = 0;
  if ((this->m_history).d.size != 0) {
    uVar15 = 0;
    do {
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::fromLocalFile((QString *)local_58.data);
      if (local_b8.size == 0) {
LAB_004f5abc:
        lVar13 = -1;
      }
      else {
        lVar2 = local_b8.size << 3;
        lVar3 = 8 - (long)local_b8.ptr;
        pQVar14 = local_b8.ptr;
        do {
          lVar13 = lVar3;
          lVar12 = lVar2;
          if (lVar12 == 0) goto LAB_004f5ab7;
          cVar4 = comparesEqual(pQVar14,(QUrl *)&local_58.shared);
          pQVar14 = pQVar14 + 1;
          lVar2 = lVar12 + -8;
          lVar3 = lVar13 + -8;
        } while (cVar4 == '\0');
        lVar13 = -((long)&local_b8.ptr[-1].d + lVar13) >> 3;
LAB_004f5ab7:
        if (lVar12 == 0) goto LAB_004f5abc;
      }
      if (lVar13 == -1) {
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
                  ((QMovableArrayOps<QUrl> *)&local_b8,0,(QUrl *)&local_58.shared);
      }
      QUrl::~QUrl((QUrl *)&local_58.shared);
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)(this->m_history).d.size);
  }
  if (local_b8.size != 0) {
    pQVar8 = QComboBox::model(&this->super_QComboBox);
    pQVar9 = QComboBox::model(&this->super_QComboBox);
    local_58._forAlignment = -NAN;
    local_58._8_8_ = (char16_t *)0x0;
    local_58._16_8_ = (long *)0x0;
    uVar6 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9);
    local_d0.d = (QUrlPrivate *)0xffffffffffffffff;
    local_c8 = 0;
    uStack_c0 = 0;
    (**(code **)(*(long *)pQVar8 + 0xf8))(pQVar8,uVar6,1,&local_d0);
    pQVar8 = QComboBox::model(&this->super_QComboBox);
    pQVar9 = QComboBox::model(&this->super_QComboBox);
    local_d0.d = (QUrlPrivate *)0xffffffffffffffff;
    local_c8 = 0;
    uStack_c0 = 0;
    iVar5 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9,&local_d0);
    (**(code **)(*(long *)pQVar8 + 0x60))(&local_58,pQVar8,iVar5 + -1,0);
    local_88 = (long *)local_58._16_8_;
    local_98 = (QArrayData *)local_58.shared;
    pcStack_90 = (char16_t *)local_58._8_8_;
    pQVar8 = QComboBox::model(&this->super_QComboBox);
    QMetaObject::tr((char *)&local_d0,(char *)&QFileDialog::staticMetaObject,0x6f4cf4);
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_d0);
    (**(code **)(*(long *)pQVar8 + 0x98))(pQVar8,&local_98,&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if ((QArrayData *)local_d0.d != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_d0.d = *(int *)local_d0.d + -1;
      UNLOCK();
      if (*(int *)local_d0.d == 0) {
        QArrayData::deallocate((QArrayData *)local_d0.d,2,0x10);
      }
    }
    QComboBox::model(&this->super_QComboBox);
    plVar10 = (long *)QMetaObject::cast((QObject *)&QStandardItemModel::staticMetaObject);
    if (plVar10 != (long *)0x0) {
      uVar7 = (**(code **)(*plVar10 + 0x138))(plVar10,&local_98);
      uVar11 = QStandardItemModel::item((int)plVar10,(int)local_98);
      QStandardItem::setFlags(uVar11,uVar7 & 0xffffffdf);
    }
    QUrlModel::addUrls(this->urlModel,(QList<QUrl> *)&local_b8,-1,false);
  }
  QComboBox::setCurrentIndex(&this->super_QComboBox,0);
  QComboBox::showPopup(&this->super_QComboBox);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogComboBox::showPopup()
{
    if (model()->rowCount() > 1)
        QComboBox::showPopup();

    urlModel->setUrls(QList<QUrl>());
    QList<QUrl> list;
    QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    while (idx.isValid()) {
        QUrl url = QUrl::fromLocalFile(idx.data(QFileSystemModel::FilePathRole).toString());
        if (url.isValid())
            list.append(url);
        idx = idx.parent();
    }
    // add "my computer"
    list.append(QUrl("file:"_L1));
    urlModel->addUrls(list, 0);
    idx = model()->index(model()->rowCount() - 1, 0);

    // append history
    QList<QUrl> urls;
    for (int i = 0; i < m_history.size(); ++i) {
        QUrl path = QUrl::fromLocalFile(m_history.at(i));
        if (!urls.contains(path))
            urls.prepend(path);
    }
    if (urls.size() > 0) {
        model()->insertRow(model()->rowCount());
        idx = model()->index(model()->rowCount()-1, 0);
        // ### TODO maybe add a horizontal line before this
        model()->setData(idx, QFileDialog::tr("Recent Places"));
        QStandardItemModel *m = qobject_cast<QStandardItemModel*>(model());
        if (m) {
            Qt::ItemFlags flags = m->flags(idx);
            flags &= ~Qt::ItemIsEnabled;
            m->item(idx.row(), idx.column())->setFlags(flags);
        }
        urlModel->addUrls(urls, -1, false);
    }
    setCurrentIndex(0);

    QComboBox::showPopup();
}